

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DIS_Logger_Playback::DIS_Logger_Playback
          (DIS_Logger_Playback *this,KString *FileName,KUINT16 BufferSz)

{
  std::fstream::fstream(this);
  this->m_ui16PreLoadLines = BufferSz;
  std::
  queue<KDIS::UTILS::DIS_Logger_Playback::Log,std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>>>
  ::
  queue<std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>>,void>
            (&this->m_qLog);
  std::fstream::open((char *)this,(_Ios_Openmode)(FileName->_M_dataplus)._M_p);
  return;
}

Assistant:

DIS_Logger_Playback::DIS_Logger_Playback(  const KString & FileName, KUINT16 BufferSz  ) :
    m_ui16PreLoadLines( BufferSz )
{
    m_File.open( FileName.c_str(), ios::in );
}